

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_ops.h
# Opt level: O0

vec<float,_2UL> hmi::operator+(vec<float,_2UL> lhs,vec<float,_2UL> rhs)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  size_t i;
  vec<float,_2UL> result;
  ulong local_20;
  vec<float,_2UL> local_18;
  vec<float,_2UL> local_10;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_8;
  
  vec<float,_2UL>::vec((vec<float,_2UL> *)&local_8.x);
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    pfVar3 = vec<float,_2UL>::operator[](&local_10,local_20);
    fVar1 = *pfVar3;
    pfVar3 = vec<float,_2UL>::operator[](&local_18,local_20);
    fVar2 = *pfVar3;
    pfVar3 = vec<float,_2UL>::operator[]((vec<float,_2UL> *)&local_8.x,local_20);
    *pfVar3 = fVar1 + fVar2;
  }
  return (vec<float,_2UL>)local_8;
}

Assistant:

constexpr
  vec<std::common_type_t<T,U>,N> operator+(vec<T,N> lhs, vec<U,N> rhs) noexcept {
    vec<std::common_type_t<T,U>,N> result;

    for (std::size_t i = 0; i < N; ++i) {
      result[i] = lhs[i] + rhs[i];
    }

    return result;
  }